

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

int skip_whitespace(istream *is)

{
  int iVar1;
  int iVar2;
  
  iVar1 = std::istream::peek();
  do {
    if (iVar1 == -1) {
      return -1;
    }
    iVar2 = isspace(iVar1);
    if (iVar2 == 0) {
      if (iVar1 != 0x3b) {
        return iVar1;
      }
      iVar1 = 0x3b;
      while ((iVar1 != -1 && (iVar1 != 10))) {
        iVar1 = std::istream::get();
      }
    }
    else {
      std::istream::get();
    }
    iVar1 = std::istream::peek();
  } while( true );
}

Assistant:

static int skip_whitespace(std::istream &is)
{
    int c;
    while(true)
    {
        c = is.peek();
        while(c != EOF && isspace(c))
        {
            is.get();
            c = is.peek();
        }
        if(c == ';')
        {
            while(c != EOF && c != '\n')
            {
                c = is.get();
            }
        }
        else
            return c;
    }
}